

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O1

void secp256k1_modinv64(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  secp256k1_modinv64_modinfo *psVar1;
  int iVar2;
  secp256k1_ge *psVar3;
  secp256k1_ge *psVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  secp256k1_ge *psVar9;
  long lVar10;
  long lVar11;
  secp256k1_ge *unaff_RBX;
  secp256k1_ge *psVar12;
  ulong uVar13;
  secp256k1_ge *psVar14;
  secp256k1_ge *psVar15;
  secp256k1_ge *a;
  long lVar16;
  uint64_t *puVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  secp256k1_ge *psVar23;
  secp256k1_ge *a_00;
  ulong uVar24;
  bool bVar25;
  secp256k1_modinv64_signed62 f;
  uint64_t c1;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_trans2x2 t;
  secp256k1_modinv64_signed62 d;
  secp256k1_modinv64_signed62 e;
  secp256k1_strauss_state sStack_b30;
  secp256k1_gej sStack_b18;
  secp256k1_fe asStack_a80 [8];
  secp256k1_ge asStack_900 [8];
  secp256k1_strauss_point_state sStack_5c0;
  secp256k1_ge *psStack_1b0;
  secp256k1_ge *psStack_1a8;
  code *pcStack_1a0;
  secp256k1_ge *local_190;
  secp256k1_ge *local_188;
  secp256k1_modinv64_modinfo *local_180;
  ulong local_178;
  secp256k1_ge *local_170;
  secp256k1_ge *local_168;
  ulong local_160;
  secp256k1_ge *local_158;
  secp256k1_ge *local_150;
  undefined1 local_148 [96];
  ulong local_e8;
  secp256k1_ge *local_e0;
  undefined1 local_d8 [56];
  ulong local_a0;
  ulong local_98;
  secp256k1_ge *local_90;
  secp256k1_modinv64_signed62 local_88;
  secp256k1_modinv64_signed62 local_58;
  
  uVar5 = 0;
  local_88.v[2] = 0;
  local_88.v[3] = 0;
  local_88.v[0] = 0;
  local_88.v[1] = 0;
  local_88.v[4] = 0;
  local_58.v[1] = 0;
  local_58.v[4] = 0;
  local_58.v[2] = 0;
  local_58.v[3] = 0;
  local_58.v[0] = 1;
  local_148._32_8_ = (modinfo->modulus).v[4];
  local_148._0_8_ = (modinfo->modulus).v[0];
  local_158 = (secp256k1_ge *)(modinfo->modulus).v[1];
  local_160 = (modinfo->modulus).v[2];
  local_188 = (secp256k1_ge *)(modinfo->modulus).v[3];
  local_d8._0_8_ = x->v[0];
  local_168 = (secp256k1_ge *)x->v[1];
  local_170 = (secp256k1_ge *)x->v[2];
  local_150 = (secp256k1_ge *)x->v[3];
  a_00 = (secp256k1_ge *)x->v[4];
  uVar24 = 0xffffffffffffffff;
  psVar12 = (secp256k1_ge *)local_148._0_8_;
  psVar15 = (secp256k1_ge *)local_d8._0_8_;
  psVar4 = (secp256k1_ge *)local_148._32_8_;
  local_180 = modinfo;
  local_148._8_8_ = local_158;
  local_148._16_8_ = local_160;
  local_148._24_8_ = local_188;
  local_148._48_8_ = x;
  local_d8._8_8_ = local_168;
  local_d8._16_8_ = local_170;
  local_d8._24_8_ = local_150;
  local_d8._32_8_ = a_00;
  do {
    psVar1 = local_180;
    uVar22 = 8;
    lVar8 = 3;
    uVar7 = 0;
    uVar20 = 0;
    psVar14 = (secp256k1_ge *)0x8;
    local_190 = (secp256k1_ge *)0x8;
    psVar3 = psVar15;
    psVar9 = psVar12;
    psVar23 = a_00;
    do {
      local_148._72_8_ = uVar5;
      local_148._80_8_ = a_00;
      local_148._88_8_ = psVar4;
      if (((ulong)psVar9 & 1) == 0) {
        pcStack_1a0 = (code *)0x14e590;
        secp256k1_modinv64_cold_29();
        a = (secp256k1_ge *)x;
LAB_0014e590:
        pcStack_1a0 = (code *)0x14e595;
        secp256k1_modinv64_cold_1();
LAB_0014e595:
        pcStack_1a0 = (code *)0x14e59a;
        secp256k1_modinv64_cold_2();
LAB_0014e59a:
        pcStack_1a0 = (code *)0x14e59f;
        secp256k1_modinv64_cold_28();
        goto LAB_0014e59f;
      }
      a = (secp256k1_ge *)(uVar7 * (long)psVar15 + uVar22 * (long)psVar12);
      psVar14 = (secp256k1_ge *)((long)psVar9 << ((byte)lVar8 & 0x3f));
      if (a != psVar14) goto LAB_0014e590;
      a = (secp256k1_ge *)((long)local_190 * (long)psVar15 + uVar20 * (long)psVar12);
      psVar14 = (secp256k1_ge *)((long)psVar3 << ((byte)lVar8 & 0x3f));
      if (a != psVar14) goto LAB_0014e595;
      psVar14 = (secp256k1_ge *)((long)uVar24 >> 0x3f);
      local_e8 = (ulong)((uint)psVar3 & 1);
      uVar6 = -local_e8;
      x = (secp256k1_modinv64_signed62 *)((ulong)psVar14 & uVar6);
      uVar24 = uVar24 ^ (ulong)x;
      unaff_RBX = psVar12;
      a = (secp256k1_ge *)x;
      psVar23 = psVar15;
      local_e0 = psVar14;
      if (uVar24 - 0x251 < 0xfffffffffffffb61) goto LAB_0014e59a;
      uVar24 = uVar24 - 1;
      a = (secp256k1_ge *)
          ((long)(local_190->x).n + (((ulong)psVar14 ^ uVar7) - (long)psVar14 & uVar6));
      uVar7 = (uVar7 + ((ulong)a & (ulong)x)) * 2;
      uVar20 = uVar20 + (((ulong)psVar14 ^ uVar22) - (long)psVar14 & uVar6);
      uVar22 = (uVar22 + (uVar20 & (ulong)x)) * 2;
      uVar6 = (long)(psVar3->x).n + (((ulong)psVar14 ^ (ulong)psVar9) - (long)psVar14 & uVar6);
      psVar3 = (secp256k1_ge *)(uVar6 >> 1);
      psVar9 = (secp256k1_ge *)((long)(psVar9->x).n + (uVar6 & (ulong)x));
      lVar8 = lVar8 + 1;
      local_190 = a;
    } while (lVar8 != 0x3e);
    psVar14 = (secp256k1_ge *)(uVar7 * uVar20);
    local_d8._48_8_ = uVar22;
    local_a0 = uVar7;
    local_98 = uVar20;
    local_90 = a;
    if ((SUB168(SEXT816((long)uVar22) * SEXT816((long)a),8) -
        SUB168(SEXT816((long)uVar7) * SEXT816((long)uVar20),8)) -
        (ulong)((secp256k1_ge *)(uVar22 * (long)a) < psVar14) != 2 ||
        (long)(uVar22 * (long)a) - (long)psVar14 != 0) {
LAB_0014e59f:
      pcStack_1a0 = (code *)0x14e5a4;
      secp256k1_modinv64_cold_3();
LAB_0014e5a4:
      pcStack_1a0 = (code *)0x14e5a9;
      secp256k1_modinv64_cold_27();
LAB_0014e5a9:
      pcStack_1a0 = (code *)0x14e5ae;
      secp256k1_modinv64_cold_26();
LAB_0014e5ae:
      psVar4 = a;
      pcStack_1a0 = (code *)0x14e5b3;
      secp256k1_modinv64_cold_25();
LAB_0014e5b3:
      pcStack_1a0 = (code *)0x14e5b8;
      secp256k1_modinv64_cold_24();
LAB_0014e5b8:
      pcStack_1a0 = (code *)0x14e5bd;
      secp256k1_modinv64_cold_4();
LAB_0014e5bd:
      pcStack_1a0 = (code *)0x14e5c2;
      secp256k1_modinv64_cold_5();
LAB_0014e5c2:
      pcStack_1a0 = (code *)0x14e5c7;
      secp256k1_modinv64_cold_6();
LAB_0014e5c7:
      pcStack_1a0 = (code *)0x14e5cc;
      secp256k1_modinv64_cold_7();
LAB_0014e5cc:
      pcStack_1a0 = (code *)0x14e5d1;
      secp256k1_modinv64_cold_8();
LAB_0014e5d1:
      pcStack_1a0 = (code *)0x14e5d6;
      secp256k1_modinv64_cold_9();
LAB_0014e5d6:
      pcStack_1a0 = (code *)0x14e5db;
      secp256k1_modinv64_cold_10();
      psVar12 = unaff_RBX;
LAB_0014e5db:
      pcStack_1a0 = (code *)0x14e5e0;
      secp256k1_modinv64_cold_11();
LAB_0014e5e0:
      pcStack_1a0 = (code *)0x14e5e5;
      secp256k1_modinv64_cold_12();
      a_00 = psVar23;
LAB_0014e5e5:
      pcStack_1a0 = (code *)0x14e5ea;
      secp256k1_modinv64_cold_13();
LAB_0014e5ea:
      pcStack_1a0 = (code *)0x14e5ef;
      secp256k1_modinv64_cold_14();
LAB_0014e5ef:
      pcStack_1a0 = (code *)0x14e5f4;
      secp256k1_modinv64_cold_15();
LAB_0014e5f4:
      pcStack_1a0 = (code *)0x14e5f9;
      secp256k1_modinv64_cold_23();
      psVar15 = psVar14;
LAB_0014e5f9:
      pcStack_1a0 = (code *)0x14e5fe;
      secp256k1_modinv64_cold_22();
LAB_0014e5fe:
      x = (secp256k1_modinv64_signed62 *)psVar4;
      pcStack_1a0 = (code *)0x14e603;
      secp256k1_modinv64_cold_21();
      unaff_RBX = psVar12;
LAB_0014e603:
      pcStack_1a0 = (code *)0x14e608;
      secp256k1_modinv64_cold_20();
LAB_0014e608:
      pcStack_1a0 = (code *)0x14e60d;
      secp256k1_modinv64_cold_19();
LAB_0014e60d:
      pcStack_1a0 = (code *)0x14e612;
      secp256k1_modinv64_cold_18();
      goto LAB_0014e612;
    }
    pcStack_1a0 = (code *)0x14dd3b;
    local_178 = uVar20;
    secp256k1_modinv64_update_de_62
              (&local_88,&local_58,(secp256k1_modinv64_trans2x2 *)(local_d8 + 0x30),local_180);
    a = (secp256k1_ge *)local_148;
    psVar14 = (secp256k1_ge *)0x5;
    pcStack_1a0 = (code *)0x14dd54;
    iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a,5,&psVar1->modulus,-1);
    if (iVar2 < 1) goto LAB_0014e5a4;
    a = (secp256k1_ge *)local_148;
    psVar14 = (secp256k1_ge *)0x5;
    pcStack_1a0 = (code *)0x14dd75;
    iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a,5,&local_180->modulus,1);
    if (0 < iVar2) goto LAB_0014e5a9;
    psVar4 = (secp256k1_ge *)local_d8;
    psVar14 = (secp256k1_ge *)0x5;
    pcStack_1a0 = (code *)0x14dd9e;
    a = psVar4;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar4,5,&local_180->modulus,-1);
    if (iVar2 < 1) goto LAB_0014e5ae;
    psVar14 = (secp256k1_ge *)0x5;
    pcStack_1a0 = (code *)0x14ddbd;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar4,5,&local_180->modulus,1);
    psVar1 = local_180;
    if (-1 < iVar2) goto LAB_0014e5b3;
    psVar4 = (secp256k1_ge *)(uVar22 * (long)psVar12);
    psVar14 = SUB168(SEXT816((long)uVar22) * SEXT816((long)psVar12),8);
    uVar5 = uVar7 * (long)psVar15;
    lVar8 = SUB168(SEXT816((long)uVar7) * SEXT816((long)psVar15),8);
    if ((-1 < lVar8) &&
       (uVar20 = (ulong)((secp256k1_ge *)(-1 - uVar5) < psVar4),
       lVar10 = (0x7fffffffffffffff - lVar8) - (long)psVar14,
       (SBORROW8(0x7fffffffffffffff - lVar8,(long)psVar14) != SBORROW8(lVar10,uVar20)) !=
       (long)(lVar10 - uVar20) < 0)) goto LAB_0014e5b8;
    puVar17 = (uint64_t *)((long)(psVar4->x).n + uVar5);
    lVar8 = (long)(psVar14->x).n + (ulong)CARRY8(uVar5,(ulong)psVar4) + lVar8;
    psVar4 = (secp256k1_ge *)(local_178 * (long)psVar12);
    psVar14 = SUB168(SEXT816((long)local_178) * SEXT816((long)psVar12),8);
    uVar5 = (long)local_190 * (long)psVar15;
    lVar10 = SUB168(SEXT816((long)local_190) * SEXT816((long)psVar15),8);
    if ((-1 < lVar10) &&
       (uVar20 = (ulong)((secp256k1_ge *)(-1 - uVar5) < psVar4),
       lVar11 = (0x7fffffffffffffff - lVar10) - (long)psVar14,
       (SBORROW8(0x7fffffffffffffff - lVar10,(long)psVar14) != SBORROW8(lVar11,uVar20)) !=
       (long)(lVar11 - uVar20) < 0)) goto LAB_0014e5bd;
    bVar25 = CARRY8((ulong)psVar4,uVar5);
    psVar4 = (secp256k1_ge *)((long)(psVar4->x).n + uVar5);
    psVar14 = (secp256k1_ge *)((long)(psVar14->x).n + (ulong)bVar25 + lVar10);
    if (((ulong)puVar17 & 0x3ffffffffffffffe) != 0) goto LAB_0014e5c2;
    if (((ulong)psVar4 & 0x3fffffffffffffff) != 0) goto LAB_0014e5c7;
    uVar5 = (ulong)puVar17 >> 0x3e | lVar8 * 4;
    uVar20 = (long)local_158 * uVar22 + uVar5;
    lVar16 = SUB168(SEXT816((long)local_158) * SEXT816((long)uVar22),8) + (lVar8 >> 0x3e) +
             (ulong)CARRY8((long)local_158 * uVar22,uVar5);
    unaff_RBX = (secp256k1_ge *)((long)local_168 * uVar7);
    lVar11 = SUB168(SEXT816((long)local_168) * SEXT816((long)uVar7),8);
    uVar5 = (ulong)(-(long)unaff_RBX - 1U < uVar20);
    lVar8 = (0x7fffffffffffffff - lVar11) - lVar16;
    lVar18 = (-0x8000000000000000 - lVar11) - (ulong)(unaff_RBX != (secp256k1_ge *)0x0);
    lVar10 = lVar16 - lVar18;
    bVar25 = (SBORROW8(0x7fffffffffffffff - lVar11,lVar16) != SBORROW8(lVar8,uVar5)) ==
             (long)(lVar8 - uVar5) < 0;
    if (lVar11 < 0) {
      bVar25 = (SBORROW8(lVar16,lVar18) !=
               SBORROW8(lVar10,(ulong)(uVar20 < (ulong)-(long)unaff_RBX))) ==
               (long)(lVar10 - (ulong)(uVar20 < (ulong)-(long)unaff_RBX)) < 0;
    }
    psVar23 = local_168;
    if (!bVar25) goto LAB_0014e5cc;
    uVar5 = (ulong)psVar4 >> 0x3e | (long)psVar14 * 4;
    uVar13 = (long)local_158 * local_178 + uVar5;
    lVar10 = SUB168(SEXT816((long)local_158) * SEXT816((long)local_178),8) + ((long)psVar14 >> 0x3e)
             + (ulong)CARRY8((long)local_158 * local_178,uVar5);
    uVar6 = (long)local_168 * (long)local_190;
    psVar4 = SUB168(SEXT816((long)local_168) * SEXT816((long)local_190),8);
    uVar5 = (ulong)(-uVar6 - 1 < uVar13);
    lVar8 = (0x7fffffffffffffff - (long)psVar4) - lVar10;
    psVar14 = (secp256k1_ge *)((-0x8000000000000000 - (long)psVar4) - (ulong)(uVar6 != 0));
    bVar25 = (SBORROW8(0x7fffffffffffffff - (long)psVar4,lVar10) != SBORROW8(lVar8,uVar5)) ==
             (long)(lVar8 - uVar5) < 0;
    if ((long)psVar4 < 0) {
      bVar25 = (SBORROW8(lVar10,(long)psVar14) !=
               SBORROW8(lVar10 - (long)psVar14,(ulong)(uVar13 < -uVar6))) ==
               (long)((lVar10 - (long)psVar14) - (ulong)(uVar13 < -uVar6)) < 0;
    }
    if (!bVar25) goto LAB_0014e5d1;
    uVar5 = (long)(unaff_RBX->x).n + uVar20;
    lVar8 = lVar11 + lVar16 + (ulong)CARRY8((ulong)unaff_RBX,uVar20);
    psVar4 = (secp256k1_ge *)((long)(psVar4->x).n + (ulong)CARRY8(uVar6,uVar13) + lVar10);
    uVar20 = lVar8 * 4 | uVar5 >> 0x3e;
    local_148._0_8_ = uVar5 & 0x3fffffffffffffff;
    unaff_RBX = (secp256k1_ge *)(uVar6 + uVar13 & 0x3fffffffffffffff);
    local_158 = (secp256k1_ge *)(local_160 * uVar22 + uVar20);
    lVar10 = (lVar8 >> 0x3e) + SUB168(SEXT816((long)local_160) * SEXT816((long)uVar22),8) +
             (ulong)CARRY8(local_160 * uVar22,uVar20);
    local_168 = (secp256k1_ge *)((long)local_170 * uVar7);
    lVar11 = SUB168(SEXT816((long)local_170) * SEXT816((long)uVar7),8);
    uVar5 = (ulong)((secp256k1_ge *)(-1 - (long)local_168) < local_158);
    lVar8 = (0x7fffffffffffffff - lVar11) - lVar10;
    psVar14 = (secp256k1_ge *)
              ((-0x8000000000000000 - lVar11) - (ulong)(local_168 != (secp256k1_ge *)0x0));
    bVar25 = (SBORROW8(0x7fffffffffffffff - lVar11,lVar10) != SBORROW8(lVar8,uVar5)) ==
             (long)(lVar8 - uVar5) < 0;
    if (lVar11 < 0) {
      bVar25 = (SBORROW8(lVar10,(long)psVar14) !=
               SBORROW8(lVar10 - (long)psVar14,(ulong)(local_158 < (secp256k1_ge *)-(long)local_168)
                       )) ==
               (long)((lVar10 - (long)psVar14) -
                     (ulong)(local_158 < (secp256k1_ge *)-(long)local_168)) < 0;
    }
    psVar23 = local_170;
    local_148._64_8_ = unaff_RBX;
    local_d8._0_8_ = unaff_RBX;
    if (!bVar25) goto LAB_0014e5d6;
    uVar5 = uVar6 + uVar13 >> 0x3e | (long)psVar4 * 4;
    uVar6 = local_160 * local_178 + uVar5;
    psVar14 = (secp256k1_ge *)
              (SUB168(SEXT816((long)local_160) * SEXT816((long)local_178),8) +
               ((long)psVar4 >> 0x3e) + (ulong)CARRY8(local_160 * local_178,uVar5));
    uVar20 = (long)local_170 * (long)local_190;
    lVar18 = SUB168(SEXT816((long)local_170) * SEXT816((long)local_190),8);
    uVar5 = (ulong)(-uVar20 - 1 < uVar6);
    lVar8 = (0x7fffffffffffffff - lVar18) - (long)psVar14;
    lVar21 = (-0x8000000000000000 - lVar18) - (ulong)(uVar20 != 0);
    lVar16 = (long)psVar14 - lVar21;
    bVar25 = (SBORROW8(0x7fffffffffffffff - lVar18,(long)psVar14) != SBORROW8(lVar8,uVar5)) ==
             (long)(lVar8 - uVar5) < 0;
    if (lVar18 < 0) {
      bVar25 = (SBORROW8((long)psVar14,lVar21) != SBORROW8(lVar16,(ulong)(uVar6 < -uVar20))) ==
               (long)(lVar16 - (ulong)(uVar6 < -uVar20)) < 0;
    }
    psVar4 = (secp256k1_ge *)(ulong)bVar25;
    psVar12 = unaff_RBX;
    local_148._56_8_ = local_148._0_8_;
    if (bVar25 == false) goto LAB_0014e5db;
    uVar13 = (long)(local_158->x).n + (long)(local_168->x).n;
    lVar8 = lVar10 + lVar11 + (ulong)CARRY8((ulong)local_158,(ulong)local_168);
    psVar14 = (secp256k1_ge *)((long)(psVar14->x).n + (ulong)CARRY8(uVar6,uVar20) + lVar18);
    uVar5 = lVar8 * 4 | uVar13 >> 0x3e;
    psVar23 = (secp256k1_ge *)(uVar13 & 0x3fffffffffffffff);
    local_168 = (secp256k1_ge *)(uVar6 + uVar20 & 0x3fffffffffffffff);
    uVar13 = (long)local_188 * uVar22 + uVar5;
    lVar10 = (lVar8 >> 0x3e) + SUB168(SEXT816((long)local_188) * SEXT816((long)uVar22),8) +
             (ulong)CARRY8((long)local_188 * uVar22,uVar5);
    local_170 = (secp256k1_ge *)((long)local_150 * uVar7);
    lVar11 = SUB168(SEXT816((long)local_150) * SEXT816((long)uVar7),8);
    uVar5 = (ulong)(-(long)local_170 - 1U < uVar13);
    lVar8 = (0x7fffffffffffffff - lVar11) - lVar10;
    psVar4 = (secp256k1_ge *)
             ((-0x8000000000000000 - lVar11) - (ulong)(local_170 != (secp256k1_ge *)0x0));
    bVar25 = (SBORROW8(0x7fffffffffffffff - lVar11,lVar10) != SBORROW8(lVar8,uVar5)) ==
             (long)(lVar8 - uVar5) < 0;
    if (lVar11 < 0) {
      bVar25 = (SBORROW8(lVar10,(long)psVar4) !=
               SBORROW8(lVar10 - (long)psVar4,(ulong)(uVar13 < (ulong)-(long)local_170))) ==
               (long)((lVar10 - (long)psVar4) - (ulong)(uVar13 < (ulong)-(long)local_170)) < 0;
    }
    psVar12 = local_150;
    local_148._8_8_ = psVar23;
    local_d8._8_8_ = local_168;
    if (!bVar25) goto LAB_0014e5e0;
    uVar5 = uVar6 + uVar20 >> 0x3e | (long)psVar14 * 4;
    uVar6 = (long)local_188 * local_178 + uVar5;
    psVar4 = (secp256k1_ge *)
             (SUB168(SEXT816((long)local_188) * SEXT816((long)local_178),8) +
              ((long)psVar14 >> 0x3e) + (ulong)CARRY8((long)local_188 * local_178,uVar5));
    uVar20 = (long)local_150 * (long)local_190;
    lVar18 = SUB168(SEXT816((long)local_150) * SEXT816((long)local_190),8);
    uVar5 = (ulong)(-uVar20 - 1 < uVar6);
    lVar8 = (0x7fffffffffffffff - lVar18) - (long)psVar4;
    lVar21 = (-0x8000000000000000 - lVar18) - (ulong)(uVar20 != 0);
    lVar16 = (long)psVar4 - lVar21;
    bVar25 = (SBORROW8(0x7fffffffffffffff - lVar18,(long)psVar4) != SBORROW8(lVar8,uVar5)) ==
             (long)(lVar8 - uVar5) < 0;
    if (lVar18 < 0) {
      bVar25 = (SBORROW8((long)psVar4,lVar21) != SBORROW8(lVar16,(ulong)(uVar6 < -uVar20))) ==
               (long)(lVar16 - (ulong)(uVar6 < -uVar20)) < 0;
    }
    psVar14 = (secp256k1_ge *)(ulong)bVar25;
    a_00 = psVar23;
    local_160 = uVar13;
    if (bVar25 == false) goto LAB_0014e5e5;
    local_160 = (long)(local_170->x).n + uVar13;
    lVar8 = lVar10 + lVar11 + (ulong)CARRY8(uVar13,(ulong)local_170);
    psVar4 = (secp256k1_ge *)((long)(psVar4->x).n + (ulong)CARRY8(uVar6,uVar20) + lVar18);
    uVar5 = lVar8 * 4 | local_160 >> 0x3e;
    local_160 = local_160 & 0x3fffffffffffffff;
    local_170 = (secp256k1_ge *)(uVar6 + uVar20 & 0x3fffffffffffffff);
    local_188 = (secp256k1_ge *)(local_148._88_8_ * uVar22 + uVar5);
    lVar11 = (lVar8 >> 0x3e) + SUB168(SEXT816((long)local_148._88_8_) * SEXT816((long)uVar22),8) +
             (ulong)CARRY8(local_148._88_8_ * uVar22,uVar5);
    uVar22 = local_148._80_8_ * uVar7;
    psVar14 = SUB168(SEXT816((long)local_148._80_8_) * SEXT816((long)uVar7),8);
    uVar5 = (ulong)((secp256k1_ge *)(-1 - uVar22) < local_188);
    lVar8 = (0x7fffffffffffffff - (long)psVar14) - lVar11;
    lVar16 = (-0x8000000000000000 - (long)psVar14) - (ulong)(uVar22 != 0);
    lVar10 = lVar11 - lVar16;
    bVar25 = (SBORROW8(0x7fffffffffffffff - (long)psVar14,lVar11) != SBORROW8(lVar8,uVar5)) ==
             (long)(lVar8 - uVar5) < 0;
    if ((long)psVar14 < 0) {
      bVar25 = (SBORROW8(lVar11,lVar16) !=
               SBORROW8(lVar10,(ulong)(local_188 < (secp256k1_ge *)-uVar22))) ==
               (long)(lVar10 - (ulong)(local_188 < (secp256k1_ge *)-uVar22)) < 0;
    }
    psVar12 = (secp256k1_ge *)local_148._80_8_;
    a_00 = local_170;
    local_158 = psVar23;
    local_148._16_8_ = local_160;
    local_d8._16_8_ = local_170;
    if (!bVar25) goto LAB_0014e5ea;
    uVar5 = uVar6 + uVar20 >> 0x3e | (long)psVar4 * 4;
    a_00 = (secp256k1_ge *)(local_148._88_8_ * local_178 + uVar5);
    lVar18 = SUB168(SEXT816((long)local_148._88_8_) * SEXT816((long)local_178),8) +
             ((long)psVar4 >> 0x3e) + (ulong)CARRY8(local_148._88_8_ * local_178,uVar5);
    uVar7 = local_148._80_8_ * (long)local_190;
    lVar16 = SUB168(SEXT816((long)local_148._80_8_) * SEXT816((long)local_190),8);
    uVar5 = (ulong)((secp256k1_ge *)(-1 - uVar7) < a_00);
    lVar8 = (0x7fffffffffffffff - lVar16) - lVar18;
    lVar21 = (-0x8000000000000000 - lVar16) - (ulong)(uVar7 != 0);
    lVar10 = lVar18 - lVar21;
    bVar25 = (SBORROW8(0x7fffffffffffffff - lVar16,lVar18) != SBORROW8(lVar8,uVar5)) ==
             (long)(lVar8 - uVar5) < 0;
    if (lVar16 < 0) {
      bVar25 = (SBORROW8(lVar18,lVar21) != SBORROW8(lVar10,(ulong)(a_00 < (secp256k1_ge *)-uVar7)))
               == (long)(lVar10 - (ulong)(a_00 < (secp256k1_ge *)-uVar7)) < 0;
    }
    psVar4 = (secp256k1_ge *)(ulong)bVar25;
    if (bVar25 == false) goto LAB_0014e5ef;
    puVar17 = (uint64_t *)((long)(local_188->x).n + uVar22);
    lVar8 = (long)(psVar14->x).n + (ulong)CARRY8((ulong)local_188,uVar22) + lVar11;
    bVar25 = CARRY8((ulong)a_00,uVar7);
    a_00 = (secp256k1_ge *)((long)(a_00->x).n + uVar7);
    lVar10 = lVar18 + lVar16 + (ulong)bVar25;
    psVar14 = (secp256k1_ge *)(lVar8 * 4 | (ulong)puVar17 >> 0x3e);
    psVar4 = (secp256k1_ge *)((ulong)puVar17 & 0x3fffffffffffffff);
    psVar12 = (secp256k1_ge *)((ulong)a_00 & 0x3fffffffffffffff);
    local_148._24_8_ = psVar4;
    local_d8._24_8_ = psVar12;
    if ((lVar8 >> 0x3e) + -1 + (ulong)((secp256k1_ge *)0x7fffffffffffffff < psVar14) != -1)
    goto LAB_0014e5f4;
    a_00 = (secp256k1_ge *)((ulong)a_00 >> 0x3e | lVar10 * 4);
    psVar15 = psVar14;
    local_148._32_8_ = psVar14;
    if ((lVar10 >> 0x3e) + -1 + (ulong)((secp256k1_ge *)0x7fffffffffffffff < a_00) != -1)
    goto LAB_0014e5f9;
    x = (secp256k1_modinv64_signed62 *)local_148;
    psVar15 = (secp256k1_ge *)0x5;
    pcStack_1a0 = (code *)0x14e3eb;
    psVar3 = (secp256k1_ge *)x;
    local_188 = psVar4;
    local_d8._32_8_ = a_00;
    iVar2 = secp256k1_modinv64_mul_cmp_62(x,5,&local_180->modulus,-1);
    psVar4 = psVar3;
    if (iVar2 < 1) goto LAB_0014e5fe;
    psVar15 = (secp256k1_ge *)0x5;
    pcStack_1a0 = (code *)0x14e408;
    iVar2 = secp256k1_modinv64_mul_cmp_62(x,5,&psVar1->modulus,1);
    unaff_RBX = psVar12;
    if (0 < iVar2) goto LAB_0014e603;
    unaff_RBX = (secp256k1_ge *)local_d8;
    psVar15 = (secp256k1_ge *)0x5;
    pcStack_1a0 = (code *)0x14e434;
    x = (secp256k1_modinv64_signed62 *)unaff_RBX;
    local_150 = psVar12;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)unaff_RBX,5,&psVar1->modulus,-1);
    if (iVar2 < 1) goto LAB_0014e608;
    psVar15 = (secp256k1_ge *)0x5;
    pcStack_1a0 = (code *)0x14e451;
    x = (secp256k1_modinv64_signed62 *)unaff_RBX;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)unaff_RBX,5,&psVar1->modulus,1);
    if (-1 < iVar2) goto LAB_0014e60d;
    uVar19 = (int)local_148._72_8_ + 1;
    uVar5 = (ulong)uVar19;
    psVar12 = (secp256k1_ge *)local_148._56_8_;
    psVar15 = (secp256k1_ge *)local_148._64_8_;
    psVar4 = psVar14;
  } while (uVar19 != 10);
  x = (secp256k1_modinv64_signed62 *)local_d8;
  psVar15 = (secp256k1_ge *)0x5;
  pcStack_1a0 = (code *)0x14e499;
  iVar2 = secp256k1_modinv64_mul_cmp_62(x,5,&SECP256K1_SIGNED62_ONE,0);
  if (iVar2 == 0) {
    pcStack_1a0 = (code *)0x14e4be;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)local_148,5,&SECP256K1_SIGNED62_ONE,-1);
    a_00 = (secp256k1_ge *)local_148._48_8_;
    if (iVar2 != 0) {
      pcStack_1a0 = (code *)0x14e4e5;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)local_148,5,&SECP256K1_SIGNED62_ONE,1);
      if (iVar2 != 0) {
        psVar15 = (secp256k1_ge *)0x5;
        pcStack_1a0 = (code *)0x14e4ff;
        x = (secp256k1_modinv64_signed62 *)a_00;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)a_00,5,&SECP256K1_SIGNED62_ONE,0);
        if (iVar2 == 0) {
          x = &local_88;
          psVar15 = (secp256k1_ge *)0x5;
          pcStack_1a0 = (code *)0x14e522;
          iVar2 = secp256k1_modinv64_mul_cmp_62(x,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar2 == 0) {
            x = (secp256k1_modinv64_signed62 *)local_148;
            psVar15 = (secp256k1_ge *)0x5;
            pcStack_1a0 = (code *)0x14e541;
            iVar2 = secp256k1_modinv64_mul_cmp_62(x,5,&psVar1->modulus,1);
            if (iVar2 == 0) goto LAB_0014e549;
          }
        }
        goto LAB_0014e617;
      }
    }
LAB_0014e549:
    pcStack_1a0 = (code *)0x14e561;
    secp256k1_modinv64_normalize_62(&local_88,local_148._32_8_,psVar1);
    (a_00->x).n[4] = local_88.v[4];
    (a_00->x).n[2] = local_88.v[2];
    (a_00->x).n[3] = local_88.v[3];
    (a_00->x).n[0] = local_88.v[0];
    (a_00->x).n[1] = local_88.v[1];
    return;
  }
LAB_0014e612:
  pcStack_1a0 = (code *)0x14e617;
  secp256k1_modinv64_cold_16();
LAB_0014e617:
  pcStack_1a0 = secp256k1_eckey_pubkey_tweak_add;
  secp256k1_modinv64_cold_17();
  psStack_1b0 = unaff_RBX;
  psStack_1a8 = a_00;
  pcStack_1a0 = (code *)uVar24;
  secp256k1_gej_set_ge(&sStack_b18,(secp256k1_ge *)x);
  sStack_b30.aux = asStack_a80;
  sStack_b30.pre_a = asStack_900;
  sStack_b30.ps = &sStack_5c0;
  secp256k1_ecmult_strauss_wnaf
            (&sStack_b30,&sStack_b18,1,&sStack_b18,&secp256k1_scalar_one,(secp256k1_scalar *)psVar15
            );
  secp256k1_gej_verify(&sStack_b18);
  if (sStack_b18.infinity == 0) {
    secp256k1_ge_set_gej((secp256k1_ge *)x,&sStack_b18);
  }
  return;
}

Assistant:

static void secp256k1_modinv64(secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, zeta=-1. */
    secp256k1_modinv64_signed62 d = {{0, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 e = {{1, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
    int i;
    int64_t zeta = -1; /* zeta = -(delta+1/2); delta starts at 1/2. */

    /* Do 10 iterations of 59 divsteps each = 590 divsteps. This suffices for 256-bit inputs. */
    for (i = 0; i < 10; ++i) {
        /* Compute transition matrix and new zeta after 59 divsteps. */
        secp256k1_modinv64_trans2x2 t;
        zeta = secp256k1_modinv64_divsteps_59(zeta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv64_update_de_62(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, 1) < 0);  /* g <  modulus */

        secp256k1_modinv64_update_fg_62(&f, &g, &t);

        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, 1) < 0);  /* g <  modulus */
    }

    /* At this point sufficient iterations have been performed that g must have reached 0
     * and (if g was not originally 0) f must now equal +/- GCD of the initial f, g
     * values i.e. +/- 1, and d now contains +/- the modular inverse. */

    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &SECP256K1_SIGNED62_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and f == modulus) */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &SECP256K1_SIGNED62_ONE, -1) == 0 ||
                 secp256k1_modinv64_mul_cmp_62(&f, 5, &SECP256K1_SIGNED62_ONE, 1) == 0 ||
                 (secp256k1_modinv64_mul_cmp_62(x, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  secp256k1_modinv64_mul_cmp_62(&d, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) == 0));

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv64_normalize_62(&d, f.v[4], modinfo);
    *x = d;
}